

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProvingHelper.cpp
# Opt level: O2

void Saturation::ProvingHelper::runVampireSaturationImpl(Problem *prb,Options *opt)

{
  UnitList *units;
  ostream *poVar1;
  MainLoop *this;
  MainLoopResult sres;
  Options *in_stack_ffffffffffffffa8;
  string local_40;
  
  Kernel::Unit::onPreprocessingEnd();
  if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa1d2) & 1) != 0)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[PP] onPreprocessingEnd(), Proving Helper");
    std::endl<char,std::char_traits<char>>(poVar1);
    units = prb->_units;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"New: ",(allocator<char> *)&stack0xffffffffffffffa8);
    Shell::UIHelper::outputAllPremises((ostream *)&std::cout,units,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  Indexing::TermSharing::setPoly(DAT_00a14198);
  Shell::Options::resolveAwayAutoValues(in_stack_ffffffffffffffa8,(Problem *)0x505199);
  *(undefined4 *)(DAT_00a141a0 + 600) = 0x18;
  this = Kernel::MainLoop::createFromOptions(prb,opt);
  Kernel::MainLoop::run((MainLoopResult *)&stack0xffffffffffffffa8,this);
  *(undefined4 *)(DAT_00a141a0 + 600) = 0x1c;
  Lib::Timer::disableLimitEnforcement();
  Kernel::MainLoopResult::updateStatistics((MainLoopResult *)&stack0xffffffffffffffa8);
  (*this->_vptr_MainLoop[1])(this);
  return;
}

Assistant:

void ProvingHelper::runVampireSaturationImpl(Problem& prb, const Options& opt)
{
  Unit::onPreprocessingEnd();
  if (env.options->showPreprocessing()) {
    std::cout << "[PP] onPreprocessingEnd(), Proving Helper" << std::endl;
    UIHelper::outputAllPremises(std::cout, prb.units(), "New: ");
  }

  //decide whether to use poly or mono well-typedness test
  //after options have been read. Equality Proxy can introduce poly in mono.
  env.sharing->setPoly();

  env.options->resolveAwayAutoValues(prb);

  env.statistics->phase=ExecutionPhase::SATURATION;
  ScopedPtr<MainLoop> salg(MainLoop::createFromOptions(prb, opt));

  MainLoopResult sres(salg->run());
  env.statistics->phase=ExecutionPhase::FINALIZATION;
  Timer::disableLimitEnforcement();
  sres.updateStatistics();
}